

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_errno pcp_flow_send_msg(pcp_flow_t *flow,pcp_server_t *s)

{
  uint uVar1;
  char *pcVar2;
  undefined8 ctx_00;
  long lVar3;
  size_t sVar4;
  ssize_t sVar5;
  undefined1 local_54 [8];
  sockaddr_in6 src_saddr;
  pcp_ctx_t *ctx;
  size_t to_send_count;
  ssize_t ret;
  pcp_server_t *s_local;
  pcp_flow_t *flow_local;
  
  src_saddr._20_8_ = s->ctx;
  if (((flow->pcp_msg_buffer == (char *)0x0) || (flow->pcp_msg_len == 0)) &&
     (build_pcp_msg(flow), flow->pcp_msg_buffer == (char *)0x0)) {
    flow_local._4_4_ = PCP_ERR_SEND_FAILED;
  }
  else {
    pcp_fill_sockaddr((sockaddr *)local_54,&(flow->kd).src_ip,0,1,s->pcp_scope_id);
    for (ctx = (pcp_ctx_t *)(ulong)flow->pcp_msg_len; ctx_00 = src_saddr._20_8_,
        ctx != (pcp_ctx_t *)0x0; ctx = (pcp_ctx_t *)((long)ctx - sVar5)) {
      lVar3 = (ulong)flow->pcp_msg_len - (long)ctx;
      pcVar2 = flow->pcp_msg_buffer;
      uVar1 = flow->pcp_msg_len;
      sVar4 = get_sa_len((sockaddr *)&s->pcp_server_saddr);
      sVar5 = pcp_socket_sendto((pcp_ctx_s *)ctx_00,pcVar2 + lVar3,(ulong)uVar1 - lVar3,0x40,
                                (sockaddr_in6 *)local_54,(sockaddr *)&s->pcp_server_saddr,
                                (socklen_t)sVar4);
      if (sVar5 < 1) {
        pcp_logger(PCP_LOGLVL_WARN,"Error occurred while sending PCP packet to server %s",
                   s->pcp_server_paddr);
        return PCP_ERR_SEND_FAILED;
      }
    }
    pcp_logger(PCP_LOGLVL_INFO,"Sent PCP MSG (flow bucket:%d)",(ulong)flow->key_bucket);
    pcp_flow_clear_msg_buf(flow);
    flow_local._4_4_ = PCP_ERR_SUCCESS;
  }
  return flow_local._4_4_;
}

Assistant:

static pcp_errno pcp_flow_send_msg(pcp_flow_t *flow, pcp_server_t *s) {
    ssize_t ret;
    size_t to_send_count;
    pcp_ctx_t *ctx = s->ctx;
    struct sockaddr_in6 src_saddr;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if ((!flow->pcp_msg_buffer) || (flow->pcp_msg_len == 0)) {
        build_pcp_msg(flow);
        if (flow->pcp_msg_buffer == NULL) {
            PCP_LOG(PCP_LOGLVL_DEBUG, "Cannot build PCP MSG (flow bucket:%d)",
                    flow->key_bucket);
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_SEND_FAILED;
        }
    }

    pcp_fill_sockaddr((struct sockaddr *)&src_saddr, &flow->kd.src_ip, 0, 1,
                      s->pcp_scope_id);
    to_send_count = flow->pcp_msg_len;

    while (to_send_count != 0) {
        ret = flow->pcp_msg_len - to_send_count;

        ret = pcp_socket_sendto(
            ctx, flow->pcp_msg_buffer + ret, flow->pcp_msg_len - ret,
            MSG_DONTWAIT, &src_saddr, (struct sockaddr *)&s->pcp_server_saddr,
            SA_LEN((struct sockaddr *)&s->pcp_server_saddr));
        if (ret <= 0) {
            PCP_LOG(PCP_LOGLVL_WARN,
                    "Error occurred while sending "
                    "PCP packet to server %s",
                    s->pcp_server_paddr);
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return PCP_ERR_SEND_FAILED;
        }
        to_send_count -= ret;
    }

    PCP_LOG(PCP_LOGLVL_INFO, "Sent PCP MSG (flow bucket:%d)", flow->key_bucket);

    pcp_flow_clear_msg_buf(flow);

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return PCP_ERR_SUCCESS;
}